

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O2

rt_expression_interface<double> * __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::substitute
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined4 extraout_var;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((ulong)(*(long *)(e + 8) - *(long *)e >> 3) <= uVar3) {
      pp_Var2 = (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface;
LAB_00117b09:
      iVar1 = (*pp_Var2[2])(this);
      return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
    }
    iVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,*(undefined8 *)(*(long *)e + uVar3 * 8));
    if ((char)iVar1 != '\0') {
      this = *(rt_function_symbol<viennamath::rt_expression_interface<double>_> **)
              (*(long *)repl + uVar3 * 8);
      pp_Var2 = (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface;
      goto LAB_00117b09;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        //std::cout << "Comparing variable<" << id << "> with " << e->str() << ", result: ";
        for (std::size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        //std::cout << "FALSE" << std::endl;
        return clone();
      }